

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int cm_zlib_gzrewind(gzFile file)

{
  uLong uVar1;
  gz_stream *s;
  gzFile file_local;
  
  if ((file == (gzFile)0x0) || (*(char *)((long)file + 0xac) != 'r')) {
    file_local._4_4_ = -1;
  }
  else {
    *(undefined4 *)((long)file + 0x70) = 0;
    *(undefined4 *)((long)file + 0x74) = 0;
    *(undefined4 *)((long)file + 200) = 0xffffffff;
    *(undefined4 *)((long)file + 8) = 0;
    *(undefined8 *)file = *(undefined8 *)((long)file + 0x80);
    uVar1 = cm_zlib_crc32(0,(uchar *)0x0,0);
    *(uLong *)((long)file + 0x90) = uVar1;
    if (*(int *)((long)file + 0xa8) == 0) {
      cm_zlib_inflateReset((z_streamp_conflict)file);
    }
    *(undefined8 *)((long)file + 0xb8) = 0;
    *(undefined8 *)((long)file + 0xc0) = 0;
    file_local._4_4_ = fseek(*(FILE **)((long)file + 0x78),*(long *)((long)file + 0xb0),0);
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzrewind (file)
    gzFile file;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || s->mode != 'r') return -1;

    s->z_err = Z_OK;
    s->z_eof = 0;
    s->back = EOF;
    s->stream.avail_in = 0;
    s->stream.next_in = s->inbuf;
    s->crc = crc32(0L, Z_NULL, 0);
    if (!s->transparent) (void)inflateReset(&s->stream);
    s->in = 0;
    s->out = 0;
    return fseek(s->file, s->start, SEEK_SET);
}